

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

int LiteScript::Syntax::ReadControlSwitch
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  bool local_1c1;
  bool local_1ab;
  bool local_1a9;
  bool local_1a1;
  Instruction local_160;
  Instruction local_150;
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [32];
  int local_118;
  int local_114;
  int sz;
  int it;
  Instruction local_100;
  Instruction local_f0;
  Instruction local_e0;
  Instruction local_d0;
  Instruction local_c0;
  Instruction local_b0;
  Instruction local_a0;
  Instruction local_90;
  Instruction local_80;
  int local_6c;
  int local_68;
  int jb;
  int jen;
  int jtn;
  int tmp;
  int i;
  string local_48 [8];
  string keyword;
  ErrorType *errorType_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl_local;
  char *text_local;
  
  std::__cxx11::string::string(local_48);
  uVar3 = ReadName(text,(string *)local_48);
  if ((uVar3 == 0) ||
     (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"switch"), bVar2)) {
    text_local._4_4_ = 0;
    goto LAB_0017574b;
  }
  jtn = 6;
  uVar3 = ReadWhitespace(text + 6);
  jtn = uVar3 + jtn;
  if (text[jtn] != '(') {
    *errorType = SCRPT_ERROR_PARENTHESIS_OPEN;
    text_local._4_4_ = -jtn;
    goto LAB_0017574b;
  }
  jtn = jtn + 1;
  uVar3 = ReadWhitespace(text + jtn);
  jtn = jtn + uVar3;
  jen = ReadExpression(text + jtn,instrl,errorType);
  if (jen < 1) {
    if (jen == 0) {
      *errorType = SCRPT_ERROR_EXPRESSION;
      text_local._4_4_ = -jtn;
    }
    else {
      text_local._4_4_ = jen - jtn;
    }
    goto LAB_0017574b;
  }
  jtn = jen + jtn;
  uVar3 = ReadWhitespace(text + jtn);
  jtn = uVar3 + jtn;
  if (text[jtn] != ')') {
    *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
    text_local._4_4_ = -jtn;
    goto LAB_0017574b;
  }
  jtn = jtn + 1;
  uVar3 = ReadWhitespace(text + jtn);
  jtn = uVar3 + jtn;
  if (text[jtn] != '{') {
    *errorType = SCRPT_ERROR_BRACE_OPEN;
    text_local._4_4_ = -jtn;
    goto LAB_0017574b;
  }
  jtn = jtn + 1;
  uVar3 = ReadWhitespace(text + jtn);
  jtn = uVar3 + jtn;
  jb = -1;
  local_68 = -1;
  sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                    (instrl);
  local_6c = (int)sVar4;
  while (text[jtn] != '}') {
    jen = ReadWhitespace(text + jtn);
    if (jen < 1) {
      uVar3 = ReadName(text + jtn,(string *)local_48);
      if (uVar3 == 0) {
        *errorType = SCRPT_ERROR_SWITCH_END;
        text_local._4_4_ = -jtn;
        goto LAB_0017574b;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"case");
      if (!bVar2) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"default");
        if (!bVar2) {
          *errorType = SCRPT_ERROR_SWITCH_KEYWORDS;
          text_local._4_4_ = -jtn;
          goto LAB_0017574b;
        }
        jtn = jtn + 7;
        uVar3 = ReadWhitespace(text + jtn);
        jtn = uVar3 + jtn;
        if (text[jtn] != ':') {
          *errorType = SCRPT_ERROR_COLON;
          text_local._4_4_ = -jtn;
          goto LAB_0017574b;
        }
        jtn = jtn + 1;
        uVar3 = ReadWhitespace(text + jtn);
        jtn = uVar3 + jtn;
        if (-1 < jb) {
          sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                  size(instrl);
          Instruction::Instruction(&local_e0,INSTR_JUMP_TO,(int)sVar4);
          pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                   operator[](instrl,(long)jb);
          Instruction::operator=(pvVar5,&local_e0);
          Instruction::~Instruction(&local_e0);
        }
        if (-1 < local_68) {
          sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                  size(instrl);
          Instruction::Instruction(&local_f0,INSTR_JUMP_ELSE,(int)sVar4);
          pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                   operator[](instrl,(long)local_68);
          Instruction::operator=(pvVar5,&local_f0);
          Instruction::~Instruction(&local_f0);
        }
        goto LAB_001752ca;
      }
      jtn = jtn + 4;
      uVar3 = ReadWhitespace(text + jtn);
      jtn = jtn + uVar3;
      Instruction::Instruction(&local_80,INSTR_VALUE_COPY);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                (instrl,&local_80);
      Instruction::~Instruction(&local_80);
      jen = ReadExpression(text + jtn,instrl,errorType);
      if (jen < 1) {
        if (jen == 0) {
          *errorType = SCRPT_ERROR_EXPRESSION;
          text_local._4_4_ = -jtn;
        }
        else {
          text_local._4_4_ = jen - jtn;
        }
        goto LAB_0017574b;
      }
      jtn = jen + jtn;
      uVar3 = ReadWhitespace(text + jtn);
      jtn = uVar3 + jtn;
      if (text[jtn] != ':') {
        *errorType = SCRPT_ERROR_COLON;
        text_local._4_4_ = -jtn;
        goto LAB_0017574b;
      }
      jtn = jtn + 1;
      uVar3 = ReadWhitespace(text + jtn);
      jtn = jtn + uVar3;
      Instruction::Instruction(&local_90,INSTR_OP_EQU);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                (instrl,&local_90);
      Instruction::~Instruction(&local_90);
      sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                        (instrl);
      local_68 = (int)sVar4;
      Instruction::Instruction(&local_a0,INSTR_JUMP_ELSE);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                (instrl,&local_a0);
      Instruction::~Instruction(&local_a0);
      if (-1 < jb) {
        sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                          (instrl);
        Instruction::Instruction(&local_b0,INSTR_JUMP_TO,(int)sVar4);
        pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                 operator[](instrl,(long)jb);
        Instruction::operator=(pvVar5,&local_b0);
        Instruction::~Instruction(&local_b0);
      }
      while( true ) {
        local_1a1 = false;
        if (text[jtn] != '}') {
          uVar3 = ReadName(text + jtn,(string *)local_48);
          local_1a9 = true;
          if (uVar3 != 0) {
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"case");
            local_1ab = false;
            if (bVar2) {
              local_1ab = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_48,"default");
            }
            local_1a9 = local_1ab;
          }
          local_1a1 = local_1a9;
        }
        if (local_1a1 == false) break;
        jen = ReadWhitespace(text + jtn);
        if (jen < 1) {
          jen = ReadInstruction(text + jtn,instrl,errorType);
          if (jen < 1) {
            if (jen == 0) {
              *errorType = SCRPT_ERROR_UNKNOW;
              text_local._4_4_ = -jtn;
            }
            else {
              text_local._4_4_ = jen - jtn;
            }
            goto LAB_0017574b;
          }
          jtn = jen + jtn;
        }
        else {
          jtn = jen + jtn;
        }
      }
      sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                        (instrl);
      jb = (int)sVar4;
      Instruction::Instruction(&local_c0,INSTR_JUMP_TO);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                (instrl,&local_c0);
      Instruction::~Instruction(&local_c0);
      if (-1 < local_68) {
        sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                          (instrl);
        Instruction::Instruction(&local_d0,INSTR_JUMP_ELSE,(int)sVar4);
        pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                 operator[](instrl,(long)local_68);
        Instruction::operator=(pvVar5,&local_d0);
        Instruction::~Instruction(&local_d0);
      }
    }
    else {
      jtn = jen + jtn;
    }
  }
  goto LAB_001753c2;
LAB_001752ca:
  if (text[jtn] != '}') {
    jen = ReadWhitespace(text + jtn);
    if (jen < 1) {
      jen = ReadInstruction(text + jtn,instrl,errorType);
      if (jen < 1) {
        if (jen == 0) {
          *errorType = SCRPT_ERROR_UNKNOW;
          text_local._4_4_ = -jtn;
        }
        else {
          text_local._4_4_ = jen - jtn;
        }
        goto LAB_0017574b;
      }
      jtn = jen + jtn;
    }
    else {
      jtn = jen + jtn;
    }
    goto LAB_001752ca;
  }
LAB_001753c2:
  if (text[jtn] == '}') {
    if (-1 < jb) {
      sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                        (instrl);
      Instruction::Instruction(&local_100,INSTR_JUMP_TO,(int)sVar4);
      pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[](instrl,(long)jb);
      Instruction::operator=(pvVar5,&local_100);
      Instruction::~Instruction(&local_100);
    }
    if (-1 < local_68) {
      sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                        (instrl);
      Instruction::Instruction((Instruction *)&sz,INSTR_JUMP_ELSE,(int)sVar4);
      pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[](instrl,(long)local_68);
      Instruction::operator=(pvVar5,(Instruction *)&sz);
      Instruction::~Instruction((Instruction *)&sz);
    }
    local_114 = local_6c;
    sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                      (instrl);
    local_118 = (int)sVar4;
    for (; local_114 < local_118; local_114 = local_114 + 1) {
      pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[](instrl,(long)local_114);
      local_13a = 0;
      local_13b = 0;
      local_1c1 = false;
      if (pvVar5->code == ';') {
        pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                 operator[](instrl,(long)local_114);
        local_1c1 = false;
        if (pvVar5->comp_type == '\x04') {
          pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                   operator[](instrl,(long)local_114);
          pcVar1 = (pvVar5->comp_value).v_string;
          std::allocator<char>::allocator();
          local_13a = 1;
          std::__cxx11::string::string(local_138,pcVar1,&local_139);
          local_13b = 1;
          local_1c1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_138,"break");
        }
      }
      if ((local_13b & 1) != 0) {
        std::__cxx11::string::~string(local_138);
      }
      if ((local_13a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
      if (local_1c1 != false) {
        Instruction::Instruction(&local_150,INSTR_JUMP_TO,local_118);
        pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                 operator[](instrl,(long)local_114);
        Instruction::operator=(pvVar5,&local_150);
        Instruction::~Instruction(&local_150);
      }
    }
    Instruction::Instruction(&local_160,INSTR_VALUE_POP);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (instrl,&local_160);
    Instruction::~Instruction(&local_160);
    text_local._4_4_ = jtn + 1;
  }
  else {
    *errorType = SCRPT_ERROR_BRACE_CLOSE;
    text_local._4_4_ = -jtn;
  }
LAB_0017574b:
  tmp = 1;
  std::__cxx11::string::~string(local_48);
  return text_local._4_4_;
}

Assistant:

int LiteScript::Syntax::ReadControlSwitch(const char *text, std::vector<Instruction> &instrl,
                                          Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "switch")
        return 0;
    int i = 6, tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '(') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ')') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '{') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jtn = -1, jen = -1, jb = instrl.size();
    while (text[i] != '}') {
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if (ReadName(text + i, keyword) > 0) {
            if (keyword == "case") {
                i += 4;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back(Instruction(InstrCode::INSTR_VALUE_COPY));
                if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
                    if (tmp != 0)
                        return tmp - i;
                    else {
                        errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                        return -i;
                    }
                }
                i += tmp;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back((Instruction(InstrCode::INSTR_OP_EQU)));
                jen = instrl.size();
                instrl.push_back((Instruction(InstrCode::INSTR_JUMP_ELSE)));
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                while (text[i] != '}' && (ReadName(text + i, keyword) == 0 || (keyword != "case" && keyword != "default"))){
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                jtn = instrl.size();
                instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
            }
            else if (keyword == "default") {
                i += 7;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
                while (text[i] != '}') {
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                break;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_KEYWORDS;
                return -i;
            }
        }
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_END;
            return -i;
        }
    }
    if (text[i] != '}') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_CLOSE;
        return -i;
    }
    if (jtn >= 0)
        instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
    if (jen >= 0)
        instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
    for (int it = jb, sz = instrl.size(); it < sz; it++) {
        if (instrl[it].code == InstrCode::INSTR_JUMP_TO &&
            instrl[it].comp_type == Instruction::CompType::COMP_TYPE_STRING &&
            std::string(instrl[it].comp_value.v_string) == "break")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, sz);
    }
    instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
    return i + 1;
}